

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O1

char * __thiscall
cppnet::BufferBlock::_FindStrInMem
          (BufferBlock *this,char *buffer,char *ch,uint32_t buffer_len,uint32_t ch_len)

{
  char cVar1;
  int iVar2;
  char *__s1;
  char *pcVar3;
  char *pcVar4;
  ulong __n;
  ulong __n_00;
  
  if (buffer != (char *)0x0) {
    __n = (ulong)buffer_len;
    __n_00 = (ulong)ch_len;
    pcVar3 = buffer + (__n - __n_00);
    cVar1 = *ch;
    __s1 = (char *)memchr(buffer,(int)cVar1,__n);
    if (__s1 <= pcVar3 && __s1 != (char *)0x0) {
      pcVar4 = (char *)0x0;
      do {
        iVar2 = bcmp(__s1,ch,__n_00);
        if (iVar2 == 0) {
          return __s1;
        }
        pcVar4 = __s1 + (long)(pcVar4 + (1 - (long)buffer));
        if (__n - (long)pcVar4 < __n_00) {
          return (char *)0x0;
        }
        buffer = __s1 + 1;
        __s1 = (char *)memchr(buffer,(int)cVar1,__n - (long)pcVar4);
        if (__s1 == (char *)0x0) {
          return (char *)0x0;
        }
      } while (__s1 <= pcVar3);
      return (char *)0x0;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* BufferBlock::_FindStrInMem(const char* buffer, const char* ch, uint32_t buffer_len, uint32_t ch_len) const {
    if (!buffer) {
        return nullptr;
    }

    const char* buffer_end = buffer + buffer_len;
    const char* buff = buffer;
    const char* find = nullptr;
    size_t finded = 0;
    while(true) {
        find = (char*)memchr(buff, *ch, buffer_len - finded);
        if (!find || find > buffer_end - ch_len) {
            break;
        }
        
        if (memcmp(find, ch, ch_len) == 0) {
            return find;
        }
        finded += find - buff + 1;
        if (buffer_len - finded < ch_len) {
            break;
        }
        buff = ++find;
    }
    return nullptr;
}